

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

int __thiscall
clunk::Node::Search<(clunk::NodeType)0,false>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  HashEntry *this_00;
  uint32_t uVar1;
  uint uVar2;
  Node *pNVar3;
  Move MVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  Move *pMVar13;
  char cVar14;
  uint uVar15;
  Move *pMVar16;
  Move *pMVar17;
  uint uVar18;
  Move *pMVar19;
  Move *pMVar20;
  int iVar21;
  Move firstMove;
  uint local_74;
  
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  uVar18 = -alpha;
  if (0 < alpha) {
    uVar18 = alpha;
  }
  if (32000 < uVar18) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  uVar18 = -beta;
  if (0 < beta) {
    uVar18 = beta;
  }
  if (32000 < uVar18) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if ((cutNode) && (bVar5 = Move::IsValid(&this->lastMove), !bVar5)) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  _stats._48_8_ = _stats._48_8_ + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->depthChange = 0;
  this->pvCount = 0;
  if ((99 < this->rcount || (this->state & 0x20U) != 0) || (bVar5 = HasRepeated(this), bVar5)) {
    iVar7 = _drawScore;
    this->standPat = _drawScore;
    return iVar7;
  }
  iVar7 = this->ply;
  uVar18 = iVar7 - 32000;
  if (alpha < (int)uVar18) {
    alpha = uVar18;
  }
  uVar12 = 0x7d01U - iVar7;
  if (beta <= (int)(0x7d01U - iVar7)) {
    uVar12 = beta;
  }
  if (this->child == (Node *)0x0 || (int)uVar12 <= alpha) {
    return alpha;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    _stats._64_8_ = _stats._64_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  firstMove.bits = 0;
  firstMove.score = 0;
  if (_tt._32_8_ == 0) {
    __assert_fail("keyMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf7,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  if (_tt._40_8_ == 0) {
    __assert_fail("entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf8,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  _tt._0_8_ = _tt._0_8_ + 1;
  lVar11 = (_tt._32_8_ & this->positionKey) * 0x10;
  this_00 = (HashEntry *)(_tt._40_8_ + lVar11);
  if (*(ulong *)(_tt._40_8_ + lVar11) == this->positionKey) {
    _tt._8_8_ = _tt._8_8_ + 1;
    switch(this_00->flags & 7) {
    case 1:
      goto switchD_001387ed_caseD_1;
    case 2:
      goto switchD_001387ed_caseD_2;
    case 3:
      uVar1 = this_00->moveBits;
      iVar7 = HashEntry::Score(this_00,iVar7);
      Move::Init(&firstMove,uVar1,iVar7);
      iVar7 = ValidateMove<false>(this,&firstMove);
      if (iVar7 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                     );
      }
      bVar6 = this_00->flags;
      if ((((bVar6 & 0x10) != 0) && ((uint)depth <= (uint)this_00->depth)) &&
         (firstMove.score <= alpha)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        return firstMove.score;
      }
      break;
    case 4:
      uVar1 = this_00->moveBits;
      iVar7 = HashEntry::Score(this_00,iVar7);
      Move::Init(&firstMove,uVar1,iVar7);
      iVar7 = ValidateMove<false>(this,&firstMove);
      if (iVar7 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                     );
      }
      bVar6 = this_00->flags;
      if ((bVar6 & 0x10) == 0) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                     );
      }
      if (((uint)depth <= (uint)this_00->depth) &&
         (firstMove.score <= alpha || (int)uVar12 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        if (firstMove.score < (int)uVar12) {
          if ((alpha < firstMove.score) &&
             ((((ulong)firstMove & 0xff00000) == 0 && this->checks == 0) &&
              (firstMove.bits & 0xf) != 3)) {
            IncHistory(&firstMove,depth);
          }
        }
        else {
          AddKiller(this,&firstMove,depth);
        }
        return firstMove.score;
      }
      break;
    case 5:
      uVar1 = this_00->moveBits;
      iVar7 = HashEntry::Score(this_00,iVar7);
      Move::Init(&firstMove,uVar1,iVar7);
      iVar7 = ValidateMove<false>(this,&firstMove);
      if (iVar7 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                     );
      }
      bVar6 = this_00->flags;
      if ((((bVar6 & 0x10) != 0) && ((uint)depth <= (uint)this_00->depth)) &&
         ((int)uVar12 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        AddKiller(this,&firstMove,depth);
        return firstMove.score;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                   );
    }
    iVar7 = this->depthChange;
    if (((iVar7 < 1) && (this->parent->depthChange < 1)) && ((bVar6 & 8) != 0)) {
      _stats._80_8_ = _stats._80_8_ + 1;
      iVar7 = iVar7 + 1;
      this->depthChange = iVar7;
      depth = depth + 1;
    }
  }
  else {
    iVar7 = this->depthChange;
  }
  if (iVar7 < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                 );
  }
  if ((uint)depth < 4 || ((ulong)firstMove & 0xf) != 0) {
    if (((ulong)firstMove & 0xf) == 0) {
      GenerateMoves<false,false>(this,depth);
      uVar18 = this->moveCount;
      if ((int)uVar18 < 1) {
        if (this->checks != 0) {
          HashEntry::SetCheckmate(this_00,this->positionKey);
          _tt._16_8_ = _tt._16_8_ + 1;
          return this->ply + -32000;
        }
        HashEntry::SetStalemate(this_00,this->positionKey);
        _tt._24_8_ = _tt._24_8_ + 1;
switchD_001387ed_caseD_2:
        iVar7 = _drawScore;
        this->standPat = _drawScore;
        return iVar7;
      }
      uVar8 = this->moveIndex;
      if ((int)uVar8 < 0) goto LAB_001390ea;
      if (0x7f < uVar18) {
LAB_0013939a:
        __assert_fail("(moveCount >= 0) & (moveCount < MaxMoves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x915,"Move *clunk::Node::GetNextMove()");
      }
      pMVar16 = this->moves + uVar8;
      uVar15 = uVar8 + 1;
      if (uVar15 < uVar18) {
        pMVar13 = this->moves + (ulong)uVar8 + 1;
        pMVar20 = pMVar16;
        uVar8 = uVar15;
        do {
          pMVar19 = pMVar13;
          if (pMVar13->score <= pMVar20->score) {
            pMVar19 = pMVar20;
          }
          uVar8 = uVar8 + 1;
          pMVar13 = pMVar13 + 1;
          pMVar20 = pMVar19;
        } while ((int)uVar8 < (int)uVar18);
        if (pMVar19 != pMVar16) {
          MVar4 = *pMVar16;
          *pMVar16 = *pMVar19;
          *pMVar19 = MVar4;
        }
      }
      this->moveIndex = uVar15;
      Move::operator=(&firstMove,pMVar16);
      if (this->moveIndex != 1) {
        __assert_fail("moveIndex == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1023,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                     );
      }
    }
  }
  else {
    _stats._144_8_ = _stats._144_8_ + 1;
    iVar7 = Search<(clunk::NodeType)1,false>(this,uVar12 - 1,uVar12,depth - 2,false);
    if (this->pvCount == 0 || _stop != 0) {
      return iVar7;
    }
    if (this->moveCount < 1) {
      __assert_fail("moveCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100b,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                   );
    }
    if (this->pvCount < 1) {
      __assert_fail("pvCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100c,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                   );
    }
    bVar5 = Move::IsValid(this->pv);
    if (!bVar5) {
      __assert_fail("pv[0].IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100d,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                   );
    }
    Move::operator=(&firstMove,this->pv);
    this->moveIndex = 1;
  }
  if (((this->moveCount == 1) && (this->depthChange < 1)) && (this->parent->depthChange < 1)) {
    _stats._72_8_ = _stats._72_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  Exec<false>(this,&firstMove,this->child);
  iVar7 = -uVar12;
  if (depth < 2) {
    uVar8 = QSearch<true>(this->child,iVar7,-alpha,0);
  }
  else {
    uVar8 = Search<(clunk::NodeType)0,true>(this->child,iVar7,-alpha,depth - 1,!cutNode);
  }
  Undo<false>(this,&firstMove);
  uVar18 = uVar12;
  if (_stop == 0) {
    uVar15 = this->child->depthChange;
    pMVar16 = this->pv;
    Move::operator=(pMVar16,&firstMove);
    pNVar3 = this->child;
    if (pNVar3 == (Node *)0x0) {
      this->pvCount = 1;
    }
    else {
      uVar18 = pNVar3->pvCount;
      this->pvCount = uVar18 + 1;
      if (0 < (int)uVar18) {
        if (99 < uVar18) {
LAB_001394ef:
          __assert_fail("pvCount <= MaxPlies",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xc50,"void clunk::Node::UpdatePV(const Move &)");
        }
        memcpy(this->pv + 1,pNVar3->pv,(long)pNVar3->pvCount << 3);
      }
    }
    uVar18 = -uVar8;
    local_74 = ((int)uVar15 >> 0x1f & uVar15) + depth;
    if (uVar12 != uVar18 && SBORROW4(uVar12,uVar18) == (int)(uVar12 + uVar8) < 0) {
      if (SBORROW4(alpha,uVar18) == (int)(alpha + uVar8) < 0) {
        uVar8 = alpha;
        if (((firstMove.bits & 0xf) != 3 && ((ulong)firstMove & 0xff00000) == 0) &&
            this->checks == 0) {
          cVar14 = -1;
          if (-1 < (char)_hist[firstMove.bits & 0xfff]) {
            cVar14 = _hist[firstMove.bits & 0xfff];
          }
          _hist[firstMove.bits & 0xfff] = cVar14 + -1;
        }
      }
      else {
        uVar8 = uVar18;
        if ((int)uVar15 < 0) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1044,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                       );
        }
      }
      if (this->moveCount < 1) {
        GenerateMoves<false,false>(this,depth);
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104e,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                       );
        }
        if ((this->moveCount == 1) && (this->moves[0].bits != firstMove.bits)) {
          __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104f,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                       );
        }
      }
      uVar15 = this->moveIndex;
      if (1 < (int)uVar15) {
        __assert_fail("moveIndex <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1052,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                     );
      }
      if (-1 < (int)uVar15) {
        do {
          uVar2 = this->moveCount;
          if (0x7f < uVar2) goto LAB_0013939a;
          if (uVar2 <= uVar15) {
            if (uVar2 == 0) {
              __assert_fail("moveCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a3,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                           );
            }
            if ((int)uVar8 < (int)uVar18) {
              __assert_fail("best <= alpha",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a4,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                           );
            }
            if ((int)uVar12 <= (int)uVar8) {
              __assert_fail("alpha < beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a5,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                           );
            }
            if (this->pvCount < 1) {
              return uVar18;
            }
            if ((int)local_74 < 0) {
              __assert_fail("pvDepth >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a8,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                           );
            }
            bVar5 = Move::IsValid(pMVar16);
            if (bVar5) {
              uVar12 = this->pv[0].bits;
              if (((uVar12 & 0xf) != 3 && (uVar12 & 0xff00000) == 0) && this->checks == 0) {
                IncHistory(pMVar16,depth);
              }
              if ((int)uVar18 <= alpha) {
                if (uVar8 == alpha) {
                  HashEntry::Set(this_00,this->positionKey,pMVar16,alpha,this->ply,local_74,3,
                                 (uint)(0 < this->depthChange) * 8 + 0x10);
                  return uVar18;
                }
                __assert_fail("alpha == orig_alpha",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10b6,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                             );
              }
              if (local_74 == depth) {
                HashEntry::Set(this_00,this->positionKey,pMVar16,uVar18,this->ply,depth,4,
                               (uint)(0 < this->depthChange) * 8 + 0x10);
                return uVar18;
              }
              __assert_fail("pvDepth == depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10af,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                           );
            }
            __assert_fail("pv[0].IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10a9,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                         );
          }
          pMVar20 = this->moves + uVar15;
          uVar9 = uVar15 + 1;
          if (uVar9 < uVar2) {
            pMVar13 = this->moves + (ulong)uVar15 + 1;
            pMVar19 = pMVar20;
            uVar15 = uVar9;
            do {
              pMVar17 = pMVar13;
              if (pMVar13->score <= pMVar19->score) {
                pMVar17 = pMVar19;
              }
              uVar15 = uVar15 + 1;
              pMVar13 = pMVar13 + 1;
              pMVar19 = pMVar17;
            } while ((int)uVar15 < (int)uVar2);
            if (pMVar17 != pMVar20) {
              MVar4 = *pMVar20;
              *pMVar20 = *pMVar17;
              *pMVar17 = MVar4;
            }
          }
          this->moveIndex = uVar9;
          bVar5 = Move::IsValid(pMVar20);
          if (!bVar5) {
            __assert_fail("move->IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1059,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                         );
          }
          if (firstMove.bits != pMVar20->bits) {
            _stats._192_8_ = _stats._192_8_ + 1;
            Exec<false>(this,pMVar20,this->child);
            iVar21 = -uVar8;
            if (depth < 2) {
              iVar10 = QSearch<true>(this->child,~uVar8,iVar21,0);
            }
            else {
              iVar10 = Search<(clunk::NodeType)1,true>(this->child,~uVar8,iVar21,depth - 1U,true);
            }
            uVar15 = -iVar10;
            if ((SBORROW4(uVar8,uVar15) != (int)(uVar8 + iVar10) < 0) && (_stop == 0)) {
              pNVar3 = this->child;
              if (pNVar3->depthChange < 0) {
                __assert_fail("child->depthChange >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x1074,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                             );
              }
              _stats._232_8_ = _stats._232_8_ + 1;
              _stats._216_8_ = _stats._216_8_ + 1;
              if (depth < 2) {
                iVar21 = QSearch<true>(pNVar3,iVar7,iVar21,0);
              }
              else {
                iVar21 = Search<(clunk::NodeType)0,true>(pNVar3,iVar7,iVar21,depth - 1U,false);
              }
              uVar15 = -iVar21;
              _stats._224_8_ =
                   _stats._224_8_ + (ulong)(SBORROW4(uVar8,uVar15) != (int)(uVar8 + iVar21) < 0);
            }
            if (this->child->depthChange <= ~depth) {
              __assert_fail("(depth + child->depthChange) >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x1086,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                           );
            }
            Undo<false>(this,pMVar20);
            if (_stop != 0) {
              return uVar12;
            }
            if ((int)uVar18 < (int)uVar15) {
              uVar2 = this->child->depthChange;
              Move::operator=(pMVar16,pMVar20);
              pNVar3 = this->child;
              if (pNVar3 == (Node *)0x0) {
                this->pvCount = 1;
              }
              else {
                uVar18 = pNVar3->pvCount;
                this->pvCount = uVar18 + 1;
                if (0 < (int)uVar18) {
                  if (99 < uVar18) goto LAB_001394ef;
                  memcpy(this->pv + 1,pNVar3->pv,(long)pNVar3->pvCount << 3);
                }
              }
              local_74 = ((int)uVar2 >> 0x1f & uVar2) + depth;
              uVar18 = uVar15;
              if ((int)uVar12 <= (int)uVar15) {
                if (-1 < (int)uVar2) {
                  AddKiller(this,pMVar20,local_74);
                  uVar18 = -uVar15;
                  if (0 < (int)uVar15) {
                    uVar18 = uVar15;
                  }
                  if (31000 < uVar18) {
                    uVar12 = uVar15;
                  }
                  HashEntry::Set(this_00,this->positionKey,pMVar20,uVar12,this->ply,local_74,5,
                                 (uint)(0 < this->depthChange) * 8 + 0x10);
                  return uVar15;
                }
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x1090,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                             );
              }
            }
            if ((int)uVar8 < (int)uVar15) {
              bVar5 = local_74 != depth;
              uVar8 = uVar15;
              local_74 = depth;
              if (bVar5) {
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x109b,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                             );
              }
            }
            else {
              uVar15 = pMVar20->bits;
              if (((uVar15 & 0xf) != 3 && (uVar15 & 0xff00000) == 0) && this->checks == 0) {
                cVar14 = _hist[uVar15 & 0xfff];
                if ((char)_hist[uVar15 & 0xfff] < '\0') {
                  cVar14 = -1;
                }
                _hist[uVar15 & 0xfff] = cVar14 + -1;
              }
            }
          }
          uVar15 = this->moveIndex;
        } while (-1 < (int)uVar15);
      }
LAB_001390ea:
      __assert_fail("moveIndex >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x914,"Move *clunk::Node::GetNextMove()");
    }
    if ((int)uVar15 < 0) {
      __assert_fail("pvDepth == depth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x103a,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = false]"
                   );
    }
    AddKiller(this,&firstMove,local_74);
    uVar15 = -uVar8;
    if (0 < (int)uVar8) {
      uVar15 = uVar8;
    }
    if (31000 < uVar15) {
      uVar12 = uVar18;
    }
    HashEntry::Set(this_00,this->positionKey,&firstMove,uVar12,this->ply,local_74,5,
                   (uint)(0 < this->depthChange) * 8 + 0x10);
  }
switchD_001387ed_caseD_1:
  return uVar18;
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }